

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catbtor.c
# Opt level: O0

int32_t main(int32_t argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long in_RSI;
  int in_EDI;
  char *err;
  int32_t verbosity;
  int32_t i;
  uint32_t j;
  Btor2Line *l;
  Btor2LineIterator it;
  Btor2Parser *reader;
  int local_3c;
  int local_38;
  uint local_34;
  undefined1 local_28 [16];
  undefined8 local_18;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_3c = 0;
  local_38 = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  do {
    if (local_8 <= local_38) {
      if (input_name == (char *)0x0) {
        input_file = _stdin;
        input_name = "<stdin>";
      }
      else {
        input_file = (FILE *)fopen(input_name,"r");
        if ((FILE *)input_file == (FILE *)0x0) {
          fprintf(_stderr,"*** catbtor: can not open \'%s\' for reading\n",input_name);
          exit(1);
        }
        close_input = 1;
      }
      if (local_3c != 0) {
        fprintf(_stderr,"; [catbor] simple CAT for BTOR files\n; [catbor] reading \'%s\'\n",
                input_name);
        fflush(_stderr);
      }
      local_18 = btor2parser_new();
      iVar1 = btor2parser_read_lines(local_18,input_file);
      if (iVar1 == 0) {
        uVar2 = btor2parser_error(local_18);
        fprintf(_stderr,"*** catbtor: parse error in \'%s\' %s\n",input_name,uVar2);
        btor2parser_delete(local_18);
        if (close_input != 0) {
          fclose((FILE *)input_file);
        }
        exit(1);
      }
      if (close_input != 0) {
        fclose((FILE *)input_file);
      }
      if (local_3c != 0) {
        fprintf(_stderr,"; [catbor] finished parsing \'%s\'\n",input_name);
        fflush(_stderr);
        fprintf(_stderr,"; [catbor] starting to dump BTOR model to \'<stdout>\'\n");
        fflush(_stderr);
      }
      local_28 = btor2parser_iter_init(local_18);
      do {
        puVar3 = (undefined8 *)btor2parser_iter_next(local_28);
        if (puVar3 == (undefined8 *)0x0) {
          btor2parser_delete(local_18);
          if (local_3c != 0) {
            fprintf(_stderr,"; [catbor] finished dumping BTOR model to \'<stdout>\'\n");
            fflush(_stderr);
          }
          return 0;
        }
        printf("%ld %s",*puVar3,puVar3[2]);
        if (*(int *)(puVar3 + 3) == 0x2d) {
          printf(" %s",puVar3[6]);
          if (*(int *)(puVar3 + 5) == 0) {
            printf(" %ld %ld",puVar3[7],puVar3[8]);
          }
          else {
            if (*(int *)(puVar3 + 5) != 1) {
              fprintf(_stderr,"*** catbtor: invalid sort encountered\n");
              exit(1);
            }
            printf(" %u",(ulong)*(uint *)(puVar3 + 7));
          }
        }
        else if (puVar3[4] != 0) {
          printf(" %ld",puVar3[4]);
        }
        for (local_34 = 0; local_34 < *(uint *)(puVar3 + 0xd); local_34 = local_34 + 1) {
          printf(" %ld",*(undefined8 *)(puVar3[0xe] + (ulong)local_34 * 8));
        }
        if (*(int *)(puVar3 + 3) == 0x29) {
          printf(" %ld %ld",*(undefined8 *)(puVar3[0xe] + 8),*(undefined8 *)(puVar3[0xe] + 0x10));
        }
        if ((*(int *)(puVar3 + 3) == 0x26) || (*(int *)(puVar3 + 3) == 0x38)) {
          printf(" %ld",*(undefined8 *)(puVar3[0xe] + 8));
        }
        if (puVar3[0xb] != 0) {
          printf(" %s",puVar3[0xb]);
        }
        if (puVar3[0xc] != 0) {
          printf(" %s",puVar3[0xc]);
        }
        fputc(10,_stdout);
      } while( true );
    }
    iVar1 = strcmp(*(char **)(local_10 + (long)local_38 * 8),"-h");
    if (iVar1 == 0) {
      fprintf(_stderr,"usage: catbtor [-h|-v] [ <btorfile> ]\n");
      exit(1);
    }
    iVar1 = strcmp(*(char **)(local_10 + (long)local_38 * 8),"-v");
    if (iVar1 == 0) {
      local_3c = local_3c + 1;
    }
    else {
      if (**(char **)(local_10 + (long)local_38 * 8) == '-') {
        fprintf(_stderr,"*** catbtor: invalid option \'%s\' (try \'-h\')\n",
                *(undefined8 *)(local_10 + (long)local_38 * 8));
        exit(1);
      }
      if (input_name != (char *)0x0) {
        fprintf(_stderr,"*** catbtor: too many inputs (try \'-h\')\n");
        exit(1);
      }
      input_name = *(char **)(local_10 + (long)local_38 * 8);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int32_t
main (int32_t argc, char** argv)
{
  Btor2Parser* reader;
  Btor2LineIterator it;
  Btor2Line* l;
  uint32_t j;
  int32_t i, verbosity = 0;
  const char* err;
  for (i = 1; i < argc; i++)
  {
    if (!strcmp (argv[i], "-h"))
    {
      fprintf (stderr, "usage: catbtor [-h|-v] [ <btorfile> ]\n");
      exit (1);
    }
    else if (!strcmp (argv[i], "-v"))
      verbosity++;
    else if (argv[i][0] == '-')
    {
      fprintf (
          stderr, "*** catbtor: invalid option '%s' (try '-h')\n", argv[i]);
      exit (1);
    }
    else if (input_name)
    {
      fprintf (stderr, "*** catbtor: too many inputs (try '-h')\n");
      exit (1);
    }
    else
      input_name = argv[i];
  }
  if (!input_name)
  {
    input_file = stdin;
    assert (!close_input);
    input_name = "<stdin>";
  }
  else
  {
    input_file = fopen (input_name, "r");
    if (!input_file)
    {
      fprintf (
          stderr, "*** catbtor: can not open '%s' for reading\n", input_name);
      exit (1);
    }
    close_input = 1;
  }
  if (verbosity)
  {
    fprintf (stderr,
             "; [catbor] simple CAT for BTOR files\n"
             "; [catbor] reading '%s'\n",
             input_name);
    fflush (stderr);
  }
  reader = btor2parser_new ();
  if (!btor2parser_read_lines (reader, input_file))
  {
    err = btor2parser_error (reader);
    assert (err);
    fprintf (stderr, "*** catbtor: parse error in '%s' %s\n", input_name, err);
    btor2parser_delete (reader);
    if (close_input) fclose (input_file);
    exit (1);
  }
  if (close_input) fclose (input_file);
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] finished parsing '%s'\n", input_name);
    fflush (stderr);
  }
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] starting to dump BTOR model to '<stdout>'\n");
    fflush (stderr);
  }
  it = btor2parser_iter_init (reader);
  while ((l = btor2parser_iter_next (&it)))
  {
    printf ("%" PRId64 " %s", l->id, l->name);
    if (l->tag == BTOR2_TAG_sort)
    {
      printf (" %s", l->sort.name);
      switch (l->sort.tag)
      {
        case BTOR2_TAG_SORT_bitvec: printf (" %u", l->sort.bitvec.width); break;
        case BTOR2_TAG_SORT_array:
          printf (" %" PRId64 " %" PRId64, l->sort.array.index, l->sort.array.element);
          break;
        default:
          assert (0);
          fprintf (stderr, "*** catbtor: invalid sort encountered\n");
          exit (1);
      }
    }
    else if (l->sort.id)
      printf (" %" PRId64, l->sort.id);
    for (j = 0; j < l->nargs; j++) printf (" %" PRId64, l->args[j]);
    if (l->tag == BTOR2_TAG_slice) printf (" %" PRId64 " %" PRId64, l->args[1], l->args[2]);
    if (l->tag == BTOR2_TAG_sext || l->tag == BTOR2_TAG_uext)
      printf (" %" PRId64, l->args[1]);
    if (l->constant) printf (" %s", l->constant);
    if (l->symbol) printf (" %s", l->symbol);
    fputc ('\n', stdout);
  }
  btor2parser_delete (reader);
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] finished dumping BTOR model to '<stdout>'\n");
    fflush (stderr);
  }
  return 0;
}